

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void getEnvmap(char *attrName,int argc,char **argv,int *i,int part,SetAttrVector *attrs)

{
  char *__s1;
  int iVar1;
  Attribute *pAVar2;
  ostream *poVar3;
  invalid_argument *piVar4;
  allocator<char> local_1dd;
  Envmap type;
  string local_1d8 [32];
  stringstream e;
  ostream local_1a8 [16];
  int local_198;
  Attribute *local_190;
  
  if (argc + -2 < *i) {
    piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar4,"Expected an env map");
    __cxa_throw(piVar4,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  __s1 = argv[(long)*i + 1];
  iVar1 = strcmp(__s1,"latlong");
  type = ENVMAP_LATLONG;
  if (iVar1 != 0) {
    iVar1 = strcmp(__s1,"LATLONG");
    if (iVar1 != 0) {
      iVar1 = strcmp(__s1,"cube");
      type = ENVMAP_CUBE;
      if (iVar1 != 0) {
        iVar1 = strcmp(__s1,"CUBE");
        if (iVar1 != 0) {
          std::__cxx11::stringstream::stringstream((stringstream *)&e);
          poVar3 = std::operator<<(local_1a8,"The value for the ");
          poVar3 = std::operator<<(poVar3,attrName);
          std::operator<<(poVar3," attribute must be either LATLONG or CUBE");
          piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
          std::__cxx11::stringbuf::str();
          std::invalid_argument::invalid_argument(piVar4,local_1d8);
          __cxa_throw(piVar4,&std::invalid_argument::typeinfo,
                      std::invalid_argument::~invalid_argument);
        }
      }
    }
  }
  std::__cxx11::string::string<std::allocator<char>>(local_1d8,attrName,&local_1dd);
  pAVar2 = (Attribute *)operator_new(0x10);
  Imf_3_4::TypedAttribute<Imf_3_4::Envmap>::TypedAttribute((Envmap *)pAVar2);
  std::__cxx11::string::string((string *)&e,local_1d8);
  local_198 = part;
  local_190 = pAVar2;
  std::vector<SetAttr,_std::allocator<SetAttr>_>::emplace_back<SetAttr>(attrs,(SetAttr *)&e);
  std::__cxx11::string::~string((string *)&e);
  std::__cxx11::string::~string(local_1d8);
  *i = *i + 2;
  return;
}

Assistant:

void
getEnvmap (
    const char     attrName[],
    int            argc,
    char**         argv,
    int&           i,
    int            part,
    SetAttrVector& attrs)
{
    if (i > argc - 2) throw invalid_argument ("Expected an env map");

    char*  str = argv[i + 1];
    Envmap type;

    if (!strcmp (str, "latlong") || !strcmp (str, "LATLONG"))
    {
        type = ENVMAP_LATLONG;
    }
    else if (!strcmp (str, "cube") || !strcmp (str, "CUBE"))
    {
        type = ENVMAP_CUBE;
    }
    else
    {
        std::stringstream e;
        e << "The value for the " << attrName
          << " attribute must be either LATLONG or CUBE";
        throw invalid_argument (e.str ());
    }

    attrs.push_back (SetAttr (attrName, part, new EnvmapAttribute (type)));
    i += 2;
}